

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O2

bool __thiscall
cmInstallCxxModuleBmiGenerator::Compute(cmInstallCxxModuleBmiGenerator *this,cmLocalGenerator *lg)

{
  cmGeneratorTarget *pcVar1;
  
  this->LocalGenerator = lg;
  pcVar1 = cmLocalGenerator::FindLocalNonAliasGeneratorTarget(lg,&this->TargetName);
  this->Target = pcVar1;
  if (pcVar1 == (cmGeneratorTarget *)0x0) {
    pcVar1 = cmGlobalGenerator::FindGeneratorTarget(lg->GlobalGenerator,&this->TargetName);
    this->Target = pcVar1;
  }
  return true;
}

Assistant:

bool cmInstallCxxModuleBmiGenerator::Compute(cmLocalGenerator* lg)
{
  this->LocalGenerator = lg;

  this->Target = lg->FindLocalNonAliasGeneratorTarget(this->TargetName);
  if (!this->Target) {
    // If no local target has been found, find it in the global scope.
    this->Target =
      lg->GetGlobalGenerator()->FindGeneratorTarget(this->TargetName);
  }

  return true;
}